

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O0

uint32_t icu_63::CollationFastLatin::nextPair
                   (uint16_t *table,UChar32 c,uint32_t ce,UChar *s16,uint8_t *s8,int32_t *sIndex,
                   int32_t *sLength)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int32_t length;
  int32_t x;
  int32_t head;
  int32_t i;
  int32_t i2;
  uint uStack_44;
  uint8_t t;
  int32_t nextIndex;
  int32_t c2;
  int32_t index_1;
  int32_t index;
  int32_t *sIndex_local;
  uint8_t *s8_local;
  UChar *s16_local;
  uint32_t ce_local;
  UChar32 c_local;
  uint16_t *table_local;
  
  table_local._4_4_ = ce;
  if ((ce < 0xc00) && (0x3ff < ce)) {
    if (ce < 0x800) {
      if ((c == 0) && (*sLength < 0)) {
        *sLength = *sIndex + -1;
        table_local._4_4_ = 2;
      }
      else {
        nextIndex = (ce & 0x3ff) + 0x1c0;
        if (*sIndex != *sLength) {
          iVar2 = *sIndex;
          if (s16 == (UChar *)0x0) {
            i2 = iVar2 + 1;
            uStack_44 = (uint)s8[iVar2];
            if (0x7f < uStack_44) {
              if ((((uStack_44 < 0xc6) && (0xc1 < uStack_44)) && (i2 != *sLength)) &&
                 ((bVar1 = s8[i2], 0x7f < bVar1 && (bVar1 < 0xc0)))) {
                uStack_44 = (uStack_44 - 0xc2) * 0x40 + (uint)bVar1;
                i2 = iVar2 + 2;
              }
              else {
                iVar3 = iVar2 + 2;
                if ((*sLength <= iVar3) && (-1 < *sLength)) {
                  return 1;
                }
                if (((uStack_44 == 0xe2) && (s8[i2] == 0x80)) &&
                   ((bVar1 = s8[iVar3], 0x7f < bVar1 && (bVar1 < 0xc0)))) {
                  uStack_44 = bVar1 + 0x100;
                }
                else {
                  if (((uStack_44 != 0xef) || (s8[i2] != 0xbf)) ||
                     ((s8[iVar3] != 0xbe && (s8[iVar3] != 0xbf)))) {
                    return 1;
                  }
                  uStack_44 = 0xffffffff;
                }
                i2 = iVar2 + 3;
              }
            }
          }
          else {
            i2 = iVar2 + 1;
            uStack_44 = (uint)(ushort)s16[iVar2];
            if (0x17f < uStack_44) {
              if ((uStack_44 < 0x2000) || (0x203f < uStack_44)) {
                if ((uStack_44 != 0xfffe) && (uStack_44 != 0xffff)) {
                  return 1;
                }
                uStack_44 = 0xffffffff;
              }
              else {
                uStack_44 = uStack_44 - 0x1e80;
              }
            }
          }
          if ((uStack_44 == 0) && (*sLength < 0)) {
            *sLength = *sIndex;
            uStack_44 = 0xffffffff;
          }
          length = (int32_t)table[nextIndex];
          x = nextIndex;
          do {
            x = (length >> 9) + x;
            length = (int32_t)table[x];
          } while ((int)(length & 0x1ffU) < (int)uStack_44);
          if ((length & 0x1ffU) == uStack_44) {
            *sIndex = i2;
            nextIndex = x;
          }
        }
        if ((int)(uint)table[nextIndex] >> 9 == 1) {
          table_local._4_4_ = 1;
        }
        else {
          table_local._4_4_ = (uint32_t)table[nextIndex + 1];
          if ((int)(uint)table[nextIndex] >> 9 != 2) {
            table_local._4_4_ = CONCAT22(table[nextIndex + 2],table[nextIndex + 1]);
          }
        }
      }
    }
    else {
      table_local._4_4_ =
           CONCAT22(table[(int)((ce & 0x3ff) + 0x1c1)],table[(int)((ce & 0x3ff) + 0x1c0)]);
    }
  }
  return table_local._4_4_;
}

Assistant:

uint32_t
CollationFastLatin::nextPair(const uint16_t *table, UChar32 c, uint32_t ce,
                             const UChar *s16, const uint8_t *s8, int32_t &sIndex, int32_t &sLength) {
    if(ce >= MIN_LONG || ce < CONTRACTION) {
        return ce;  // simple or special mini CE
    } else if(ce >= EXPANSION) {
        int32_t index = NUM_FAST_CHARS + (ce & INDEX_MASK);
        return ((uint32_t)table[index + 1] << 16) | table[index];
    } else /* ce >= CONTRACTION */ {
        if(c == 0 && sLength < 0) {
            sLength = sIndex - 1;
            return EOS;
        }
        // Contraction list: Default mapping followed by
        // 0 or more single-character contraction suffix mappings.
        int32_t index = NUM_FAST_CHARS + (ce & INDEX_MASK);
        if(sIndex != sLength) {
            // Read the next character.
            int32_t c2;
            int32_t nextIndex = sIndex;
            if(s16 != NULL) {
                c2 = s16[nextIndex++];
                if(c2 > LATIN_MAX) {
                    if(PUNCT_START <= c2 && c2 < PUNCT_LIMIT) {
                        c2 = c2 - PUNCT_START + LATIN_LIMIT;  // 2000..203F -> 0180..01BF
                    } else if(c2 == 0xfffe || c2 == 0xffff) {
                        c2 = -1;  // U+FFFE & U+FFFF cannot occur in contractions.
                    } else {
                        return BAIL_OUT;
                    }
                }
            } else {
                c2 = s8[nextIndex++];
                if(c2 > 0x7f) {
                    uint8_t t;
                    if(c2 <= 0xc5 && 0xc2 <= c2 && nextIndex != sLength &&
                            0x80 <= (t = s8[nextIndex]) && t <= 0xbf) {
                        c2 = ((c2 - 0xc2) << 6) + t;  // 0080..017F
                        ++nextIndex;
                    } else {
                        int32_t i2 = nextIndex + 1;
                        if(i2 < sLength || sLength < 0) {
                            if(c2 == 0xe2 && s8[nextIndex] == 0x80 &&
                                    0x80 <= (t = s8[i2]) && t <= 0xbf) {
                                c2 = (LATIN_LIMIT - 0x80) + t;  // 2000..203F -> 0180..01BF
                            } else if(c2 == 0xef && s8[nextIndex] == 0xbf &&
                                    ((t = s8[i2]) == 0xbe || t == 0xbf)) {
                                c2 = -1;  // U+FFFE & U+FFFF cannot occur in contractions.
                            } else {
                                return BAIL_OUT;
                            }
                        } else {
                            return BAIL_OUT;
                        }
                        nextIndex += 2;
                    }
                }
            }
            if(c2 == 0 && sLength < 0) {
                sLength = sIndex;
                c2 = -1;
            }
            // Look for the next character in the contraction suffix list,
            // which is in ascending order of single suffix characters.
            int32_t i = index;
            int32_t head = table[i];  // first skip the default mapping
            int32_t x;
            do {
                i += head >> CONTR_LENGTH_SHIFT;
                head = table[i];
                x = head & CONTR_CHAR_MASK;
            } while(x < c2);
            if(x == c2) {
                index = i;
                sIndex = nextIndex;
            }
        }
        // Return the CE or CEs for the default or contraction mapping.
        int32_t length = table[index] >> CONTR_LENGTH_SHIFT;
        if(length == 1) {
            return BAIL_OUT;
        }
        ce = table[index + 1];
        if(length == 2) {
            return ce;
        } else {
            return ((uint32_t)table[index + 2] << 16) | ce;
        }
    }
}